

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANN.cpp
# Opt level: O0

ANNdist annDist(int dim,ANNpoint p,ANNpoint q)

{
  ANNcoord dist;
  ANNcoord diff;
  int d;
  ANNpoint q_local;
  ANNpoint p_local;
  int dim_local;
  
  dist = 0.0;
  for (d = 0; d < dim; d = d + 1) {
    dist = (p[d] - q[d]) * (p[d] - q[d]) + dist;
  }
  return dist;
}

Assistant:

ANNdist annDist(  // interpoint squared distance
    int dim, ANNpoint p, ANNpoint q) {
    register int d;
    register ANNcoord diff;
    register ANNcoord dist;

    dist = 0;
    for (d = 0; d < dim; d++) {
        diff = p[d] - q[d];
        dist = ANN_SUM(dist, ANN_POW(diff));
    }
    return dist;
}